

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::advance
          (SimpleParser<avro::parsing::DummyHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Kind actual;
  ProductionPtr *ss;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar1;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar2;
  ostream *poVar3;
  Exception *this_01;
  _Elt_pointer pSVar4;
  undefined1 auVar5 [16];
  string sStack_1c8;
  ostringstream oss;
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
  do {
    while( true ) {
      pSVar4 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar4 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      actual = pSVar4[-1].kind_;
      if (actual == k) goto LAB_0016f294;
      if (actual - sNull < 0xf) break;
      switch(actual) {
      case sRoot:
        ss = (ProductionPtr *)
             boost::
             any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&pSVar4[-1].extra_);
        append(this,ss);
        break;
      case sRepeater:
        ptVar1 = boost::
                 any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           (&pSVar4[-1].extra_);
        (ptVar1->super_type).head = (ptVar1->super_type).head - 1;
        append(this,&(ptVar1->super_type).tail.tail.head);
        break;
      case sIndirect:
        boost::
        any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                  ((boost *)&oss,&pSVar4[-1].extra_);
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        append(this,(ProductionPtr *)&oss);
        boost::detail::shared_count::~shared_count(local_1a0);
        break;
      case sSymbolic:
        boost::
        any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                  ((boost *)&sStack_1c8,&pSVar4[-1].extra_);
        boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
        ::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                    *)&oss,(weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                            *)&sStack_1c8);
        boost::detail::weak_count::~weak_count((weak_count *)&sStack_1c8._M_string_length);
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        append(this,(ProductionPtr *)&oss);
        boost::detail::shared_count::~shared_count(local_1a0);
        break;
      case sSkipStart:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        skip(this,this->decoder_);
        break;
      case sResolve:
        ppVar2 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                           (&pSVar4[-1].extra_);
        assertMatch(ppVar2->second,k);
        k = ppVar2->first;
LAB_0016f294:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        return k;
      default:
        if (actual == sError) {
          auVar5 = __cxa_allocate_exception(0x18);
          boost::any_cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     (boost *)&pSVar4[-1].extra_,auVar5._8_8_);
          Exception::Exception(auVar5._0_8_,(string *)&oss);
          __cxa_throw(auVar5._0_8_,&Exception::typeinfo,Exception::~Exception);
        }
      case sAlternative:
      case sPlaceholder:
      case sEnumAdjust:
      case sUnionAdjust:
        if (7 < actual - sRecordStart) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar3 = std::operator<<((ostream *)&oss,"Encountered ");
          poVar3 = std::operator<<(poVar3,*(char **)(Symbol::stringValues +
                                                    (ulong)pSVar4[-1].kind_ * 8));
          poVar3 = std::operator<<(poVar3," while looking for ");
          std::operator<<(poVar3,*(char **)(Symbol::stringValues + (ulong)k * 8));
          this_01 = (Exception *)__cxa_allocate_exception(0x18);
          std::__cxx11::stringbuf::str();
          Exception::Exception(this_01,&sStack_1c8);
          __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
        }
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        if (actual == sWriterUnion) {
          selectBranch(this,0);
        }
      }
    }
    throwMismatch(k,actual);
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }